

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O0

void __thiscall luna::GC::SweepGeneration(GC *this,GenInfo *gen)

{
  GCObject *pGVar1;
  function<void_(luna::GCObject_*,_unsigned_int)> *in_RSI;
  GCObject *obj;
  GCObject *alived;
  GCObject *__args;
  
  __args = (GCObject *)0x0;
  while (*(long *)&(in_RSI->super__Function_base)._M_functor != 0) {
    pGVar1 = *(GCObject **)&(in_RSI->super__Function_base)._M_functor;
    *(GCObject **)&(in_RSI->super__Function_base)._M_functor = pGVar1->next_;
    if (((byte)pGVar1->field_0x10 >> 2 & 3) == 1) {
      pGVar1->field_0x10 = pGVar1->field_0x10 & 0xf3;
      pGVar1->next_ = __args;
      __args = pGVar1;
    }
    else {
      std::function<void_(luna::GCObject_*,_unsigned_int)>::operator()
                (in_RSI,__args,(uint)((ulong)pGVar1 >> 0x20));
      *(int *)((long)&(in_RSI->super__Function_base)._M_functor + 8) =
           *(int *)((long)&(in_RSI->super__Function_base)._M_functor + 8) + -1;
    }
  }
  *(GCObject **)&(in_RSI->super__Function_base)._M_functor = __args;
  return;
}

Assistant:

void GC::SweepGeneration(GenInfo &gen)
    {
        GCObject *alived = nullptr;

        while (gen.gen_)
        {
            GCObject *obj = gen.gen_;
            gen.gen_ = obj->next_;

            if (obj->gc_ == GCFlag_Black)
            {
                obj->gc_ = GCFlag_White;
                obj->next_ = alived;
                alived = obj;
            }
            else
            {
                obj_deleter_(obj, obj->gc_obj_type_);
                gen.count_--;
            }
        }

        gen.gen_ = alived;
    }